

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode curl_url_get(CURLU *u,CURLUPart what,char **part,uint flags)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  CURLcode CVar4;
  char *plus;
  Curl_handler *pCVar5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  CURLUcode CVar12;
  char *pcVar13;
  char *pcVar14;
  char *scheme;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  uint uVar19;
  char *pcVar20;
  char *pcVar21;
  uint uVar22;
  char *pcVar23;
  char *pcVar24;
  bool bVar25;
  bool bVar26;
  char portbuf [7];
  char *decoded;
  size_t dlen;
  
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  if (part == (char **)0x0) {
    return CURLUE_BAD_PARTPOINTER;
  }
  uVar19 = flags >> 6 & 3;
  *part = (char *)0x0;
  CVar12 = CURLUE_UNKNOWN_PART;
  switch(what) {
  case CURLUPART_URL:
    pcVar6 = u->options;
    pcVar10 = u->port;
    if ((u->scheme == (char *)0x0) || (iVar3 = Curl_strcasecompare("file",u->scheme), iVar3 == 0)) {
      if (u->host == (char *)0x0) {
        return CURLUE_NO_HOST;
      }
      scheme = u->scheme;
      if (scheme == (char *)0x0) {
        if ((flags & 4) != 0) {
          scheme = "https";
          goto LAB_004a3691;
        }
        CVar12 = CURLUE_NO_SCHEME;
LAB_004a38f5:
        bVar25 = false;
      }
      else {
LAB_004a3691:
        pCVar5 = Curl_builtin_scheme(scheme);
        if ((flags & 1) == 0 || pcVar10 != (char *)0x0) {
          if (pCVar5 != (Curl_handler *)0x0 && pcVar10 != (char *)0x0) {
            pcVar9 = (char *)0x0;
            if (pCVar5->defport != u->portnum) {
              pcVar9 = pcVar10;
            }
            if ((flags & 2) != 0) {
              pcVar10 = pcVar9;
            }
          }
        }
        else if (pCVar5 == (Curl_handler *)0x0) {
          pCVar5 = (Curl_handler *)0x0;
          pcVar10 = (char *)0x0;
        }
        else {
          curl_msnprintf(portbuf,7,"%ld",pCVar5->defport);
          pcVar10 = portbuf;
        }
        if ((pCVar5 != (Curl_handler *)0x0) && ((pCVar5->flags & 0x400) == 0)) {
          pcVar6 = (char *)0x0;
        }
        if ((*u->host == '[') && (pcVar9 = u->zoneid, pcVar9 != (char *)0x0)) {
          sVar7 = strlen(u->host);
          sVar8 = strlen(pcVar9);
          pcVar9 = (char *)(*Curl_cmalloc)(sVar8 + sVar7 + 4);
          if (pcVar9 == (char *)0x0) {
            CVar12 = CURLUE_OUT_OF_MEMORY;
            goto LAB_004a38f5;
          }
          memcpy(pcVar9,u->host,sVar7 - 1);
          curl_msnprintf(pcVar9 + (sVar7 - 1),sVar8 + 5,"%%25%s]",u->zoneid);
        }
        else {
          pcVar9 = (char *)0x0;
        }
        pcVar15 = u->password;
        bVar25 = pcVar15 == (char *)0x0;
        pcVar1 = "    :";
        pcVar2 = "    :";
        if (bVar25) {
          pcVar2 = "PK\x01\x02";
          pcVar15 = "";
        }
        bVar26 = pcVar6 == (char *)0x0;
        pcVar16 = ";";
        if (bVar26) {
          pcVar16 = "";
          pcVar6 = "";
        }
        pcVar18 = "@";
        if (bVar26) {
          pcVar18 = "";
        }
        if (!bVar25) {
          pcVar18 = "@";
        }
        pcVar11 = u->user;
        if (pcVar11 == (char *)0x0) {
          pcVar11 = "";
        }
        else {
          pcVar18 = "@";
        }
        pcVar14 = pcVar9;
        if (pcVar9 == (char *)0x0) {
          pcVar14 = u->host;
        }
        if (pcVar10 == (char *)0x0) {
          pcVar1 = "PK\x01\x02";
          pcVar10 = "";
        }
        pcVar13 = u->path;
        if (pcVar13 == (char *)0x0) {
          pcVar13 = "/";
          pcVar21 = "";
        }
        else {
          pcVar21 = "/";
          if (*pcVar13 == '/') {
            pcVar21 = "";
          }
        }
        pcVar23 = u->query;
        pcVar20 = "";
        if ((pcVar23 != (char *)0x0) && (pcVar20 = "?", *pcVar23 == '\0')) {
          pcVar20 = "";
        }
        pcVar24 = "";
        if ((pcVar23 != (char *)0x0) && (pcVar24 = "", *pcVar23 != '\0')) {
          pcVar24 = pcVar23;
        }
        pcVar23 = u->fragment;
        pcVar17 = "#";
        if (pcVar23 == (char *)0x0) {
          pcVar17 = "";
          pcVar23 = "";
        }
        u = (CURLU *)curl_maprintf("%s://%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s",scheme,pcVar11,pcVar2 + 4,
                                   pcVar15,pcVar16,pcVar6,pcVar18,pcVar14,pcVar1 + 4,pcVar10,pcVar21
                                   ,pcVar13,pcVar20,pcVar24,pcVar17,pcVar23);
        (*Curl_cfree)(pcVar9);
        CVar12 = CURLUE_OUT_OF_MEMORY;
        bVar25 = true;
      }
      if (!bVar25) {
        return CVar12;
      }
    }
    else {
      pcVar6 = u->fragment;
      pcVar10 = "#";
      if (pcVar6 == (char *)0x0) {
        pcVar10 = "";
        pcVar6 = "";
      }
      u = (CURLU *)curl_maprintf("file://%s%s%s",u->path,pcVar10,pcVar6);
    }
    if (u == (CURLU *)0x0) goto LAB_004a3907;
    *part = (char *)u;
    goto LAB_004a3903;
  case CURLUPART_SCHEME:
    pcVar6 = u->scheme;
    CVar12 = CURLUE_NO_SCHEME;
    goto LAB_004a34f2;
  case CURLUPART_USER:
    pcVar6 = u->user;
    CVar12 = CURLUE_NO_USER;
    break;
  case CURLUPART_PASSWORD:
    pcVar6 = u->password;
    CVar12 = CURLUE_NO_PASSWORD;
    break;
  case CURLUPART_OPTIONS:
    pcVar6 = u->options;
    CVar12 = CURLUE_NO_OPTIONS;
    break;
  case CURLUPART_HOST:
    pcVar6 = u->host;
    CVar12 = CURLUE_NO_HOST;
    break;
  case CURLUPART_PORT:
    pcVar6 = u->port;
    if (((flags & 1) == 0 || pcVar6 != (char *)0x0) || (u->scheme == (char *)0x0)) {
      CVar12 = CURLUE_NO_PORT;
      if (pcVar6 == (char *)0x0) goto LAB_004a3672;
      if ((u->scheme != (char *)0x0) &&
         (pCVar5 = Curl_builtin_scheme(u->scheme), pCVar5 != (Curl_handler *)0x0)) {
        pcVar10 = (char *)0x0;
        if (pCVar5->defport != u->portnum) {
          pcVar10 = pcVar6;
        }
        if ((flags & 2) != 0) {
          pcVar6 = pcVar10;
        }
      }
    }
    else {
      pCVar5 = Curl_builtin_scheme(u->scheme);
      CVar12 = CURLUE_NO_PORT;
      if (pCVar5 == (Curl_handler *)0x0) {
LAB_004a3672:
        CVar12 = CURLUE_NO_PORT;
        uVar19 = 0;
        goto switchD_004a340b_default;
      }
      curl_msnprintf(portbuf,7,"%ld",pCVar5->defport);
      pcVar6 = portbuf;
    }
LAB_004a34f2:
    uVar22 = 0;
    uVar19 = 0;
    goto LAB_004a3565;
  case CURLUPART_PATH:
    pcVar6 = u->path;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = (*Curl_cstrdup)("/");
      u->path = pcVar6;
      if (pcVar6 == (char *)0x0) goto LAB_004a3907;
    }
    break;
  case CURLUPART_QUERY:
    pcVar6 = u->query;
    CVar12 = CURLUE_NO_QUERY;
    uVar22 = uVar19;
    goto LAB_004a3565;
  case CURLUPART_FRAGMENT:
    pcVar6 = u->fragment;
    CVar12 = CURLUE_NO_FRAGMENT;
    break;
  case CURLUPART_ZONEID:
    pcVar6 = u->zoneid;
    break;
  default:
switchD_004a340b_default:
    pcVar6 = (char *)0x0;
    uVar22 = 0;
    goto LAB_004a3565;
  }
  uVar22 = 0;
LAB_004a3565:
  if (pcVar6 != (char *)0x0) {
    pcVar6 = (*Curl_cstrdup)(pcVar6);
    *part = pcVar6;
    if (pcVar6 == (char *)0x0) {
LAB_004a3907:
      CVar12 = CURLUE_OUT_OF_MEMORY;
    }
    else {
      if ((uVar22 & 1) != 0) {
        do {
          if (*pcVar6 == '+') {
            *pcVar6 = ' ';
          }
          else if (*pcVar6 == '\0') break;
          pcVar6 = pcVar6 + 1;
        } while( true );
      }
      if ((uVar19 & 1) != 0) {
        CVar4 = Curl_urldecode((Curl_easy *)0x0,*part,0,&decoded,&dlen,true);
        (*Curl_cfree)(*part);
        pcVar6 = (char *)0x0;
        if (CVar4 == CURLE_OK) {
          pcVar6 = decoded;
        }
        *part = pcVar6;
        if (CVar4 != CURLE_OK) {
          return CURLUE_URLDECODE;
        }
      }
LAB_004a3903:
      CVar12 = CURLUE_OK;
    }
  }
  return CVar12;
}

Assistant:

CURLUcode curl_url_get(CURLU *u, CURLUPart what,
                       char **part, unsigned int flags)
{
  char *ptr;
  CURLUcode ifmissing = CURLUE_UNKNOWN_PART;
  char portbuf[7];
  bool urldecode = (flags & CURLU_URLDECODE)?1:0;
  bool plusdecode = FALSE;
  (void)flags;
  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part)
    return CURLUE_BAD_PARTPOINTER;
  *part = NULL;

  switch(what) {
  case CURLUPART_SCHEME:
    ptr = u->scheme;
    ifmissing = CURLUE_NO_SCHEME;
    urldecode = FALSE; /* never for schemes */
    break;
  case CURLUPART_USER:
    ptr = u->user;
    ifmissing = CURLUE_NO_USER;
    break;
  case CURLUPART_PASSWORD:
    ptr = u->password;
    ifmissing = CURLUE_NO_PASSWORD;
    break;
  case CURLUPART_OPTIONS:
    ptr = u->options;
    ifmissing = CURLUE_NO_OPTIONS;
    break;
  case CURLUPART_HOST:
    ptr = u->host;
    ifmissing = CURLUE_NO_HOST;
    break;
  case CURLUPART_ZONEID:
    ptr = u->zoneid;
    break;
  case CURLUPART_PORT:
    ptr = u->port;
    ifmissing = CURLUE_NO_PORT;
    urldecode = FALSE; /* never for port */
    if(!ptr && (flags & CURLU_DEFAULT_PORT) && u->scheme) {
      /* there's no stored port number, but asked to deliver
         a default one for the scheme */
      const struct Curl_handler *h =
        Curl_builtin_scheme(u->scheme);
      if(h) {
        msnprintf(portbuf, sizeof(portbuf), "%ld", h->defport);
        ptr = portbuf;
      }
    }
    else if(ptr && u->scheme) {
      /* there is a stored port number, but ask to inhibit if
         it matches the default one for the scheme */
      const struct Curl_handler *h =
        Curl_builtin_scheme(u->scheme);
      if(h && (h->defport == u->portnum) &&
         (flags & CURLU_NO_DEFAULT_PORT))
        ptr = NULL;
    }
    break;
  case CURLUPART_PATH:
    ptr = u->path;
    if(!ptr) {
      ptr = u->path = strdup("/");
      if(!u->path)
        return CURLUE_OUT_OF_MEMORY;
    }
    break;
  case CURLUPART_QUERY:
    ptr = u->query;
    ifmissing = CURLUE_NO_QUERY;
    plusdecode = urldecode;
    break;
  case CURLUPART_FRAGMENT:
    ptr = u->fragment;
    ifmissing = CURLUE_NO_FRAGMENT;
    break;
  case CURLUPART_URL: {
    char *url;
    char *scheme;
    char *options = u->options;
    char *port = u->port;
    char *allochost = NULL;
    if(u->scheme && strcasecompare("file", u->scheme)) {
      url = aprintf("file://%s%s%s",
                    u->path,
                    u->fragment? "#": "",
                    u->fragment? u->fragment : "");
    }
    else if(!u->host)
      return CURLUE_NO_HOST;
    else {
      const struct Curl_handler *h = NULL;
      if(u->scheme)
        scheme = u->scheme;
      else if(flags & CURLU_DEFAULT_SCHEME)
        scheme = (char *) DEFAULT_SCHEME;
      else
        return CURLUE_NO_SCHEME;

      if(scheme) {
        h = Curl_builtin_scheme(scheme);
        if(!port && (flags & CURLU_DEFAULT_PORT)) {
          /* there's no stored port number, but asked to deliver
             a default one for the scheme */
          if(h) {
            msnprintf(portbuf, sizeof(portbuf), "%ld", h->defport);
            port = portbuf;
          }
        }
        else if(port) {
          /* there is a stored port number, but asked to inhibit if it matches
             the default one for the scheme */
          if(h && (h->defport == u->portnum) &&
             (flags & CURLU_NO_DEFAULT_PORT))
            port = NULL;
        }
      }
      if(h && !(h->flags & PROTOPT_URLOPTIONS))
        options = NULL;

      if((u->host[0] == '[') && u->zoneid) {
        /* make it '[ host %25 zoneid ]' */
        size_t hostlen = strlen(u->host);
        size_t alen = hostlen + 3 + strlen(u->zoneid) + 1;
        allochost = malloc(alen);
        if(!allochost)
          return CURLUE_OUT_OF_MEMORY;
        memcpy(allochost, u->host, hostlen - 1);
        msnprintf(&allochost[hostlen - 1], alen - hostlen + 1,
                  "%%25%s]", u->zoneid);
      }

      url = aprintf("%s://%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s",
                    scheme,
                    u->user ? u->user : "",
                    u->password ? ":": "",
                    u->password ? u->password : "",
                    options ? ";" : "",
                    options ? options : "",
                    (u->user || u->password || options) ? "@": "",
                    allochost ? allochost : u->host,
                    port ? ":": "",
                    port ? port : "",
                    (u->path && (u->path[0] != '/')) ? "/": "",
                    u->path ? u->path : "/",
                    (u->query && u->query[0]) ? "?": "",
                    (u->query && u->query[0]) ? u->query : "",
                    u->fragment? "#": "",
                    u->fragment? u->fragment : "");
      free(allochost);
    }
    if(!url)
      return CURLUE_OUT_OF_MEMORY;
    *part = url;
    return CURLUE_OK;
  }
  default:
    ptr = NULL;
    break;
  }
  if(ptr) {
    *part = strdup(ptr);
    if(!*part)
      return CURLUE_OUT_OF_MEMORY;
    if(plusdecode) {
      /* convert + to space */
      char *plus;
      for(plus = *part; *plus; ++plus) {
        if(*plus == '+')
          *plus = ' ';
      }
    }
    if(urldecode) {
      char *decoded;
      size_t dlen;
      CURLcode res = Curl_urldecode(NULL, *part, 0, &decoded, &dlen, TRUE);
      free(*part);
      if(res) {
        *part = NULL;
        return CURLUE_URLDECODE;
      }
      *part = decoded;
    }
    return CURLUE_OK;
  }
  else
    return ifmissing;
}